

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O0

int repeat_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  repeat_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  pvVar1 = segment->data;
  if (field == 1) {
    *(bool *)value = segment->mix == repeat_segment_mix_bypass;
  }
  else if (field == 2) {
    *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 0x24);
  }
  else if (field == 0x1e) {
    *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 0x20);
  }
  else if (field == 0x1f) {
    *(undefined4 *)value = *(undefined4 *)((long)pvVar1 + 0x28);
  }
  else {
    if (field != 0x38) {
      mixed_err(7);
      return 0;
    }
    *(float *)value = (float)*(uint *)((long)pvVar1 + 0x1c) / (float)*(uint *)((long)pvVar1 + 0x24);
  }
  return 1;
}

Assistant:

int repeat_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;
  switch(field){
  case MIXED_REPEAT_TIME: *((float *)value) = data->time; break;
  case MIXED_REPEAT_MODE: *((enum mixed_repeat_mode *)value) = data->mode; break;
  case MIXED_REPEAT_POSITION: *((float *)value) = data->buffer_index/(float)data->samplerate; break;
  case MIXED_SAMPLERATE: *((uint32_t *)value) = data->samplerate; break;
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == repeat_segment_mix_bypass); break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}